

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentRecord.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::EnvironmentRecord::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EnvironmentRecord *this)

{
  ostream *poVar1;
  KINT32 Value;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  EnvironmentRecord *local_18;
  EnvironmentRecord *this_local;
  
  local_18 = this;
  this_local = (EnvironmentRecord *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Environment Record\n");
  poVar1 = std::operator<<(poVar1,"\tRecord Type: ");
  ENUMS::GetEnumAsStringEnvironmentRecordType_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)this->m_ui32EnvRecTyp,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tLength:      ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16Length);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tIndex:       ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8Index);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString EnvironmentRecord::GetAsString() const
{
    KStringStream ss;

    ss << "Environment Record\n"
       << "\tRecord Type: " << GetEnumAsStringEnvironmentRecordType( m_ui32EnvRecTyp ) << "\n"
       << "\tLength:      " << m_ui16Length                                            << "\n"
       << "\tIndex:       " << ( KUINT16 )m_ui8Index                                   << "\n";

    return ss.str();
}